

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void FBaseCVar::EnableCallbacks(void)

{
  FBaseCVar *pFVar1;
  
  m_UseCallback = true;
  for (pFVar1 = CVars; pFVar1 != (FBaseCVar *)0x0; pFVar1 = pFVar1->m_Next) {
    if (((pFVar1->Flags & 0x200) == 0) && (pFVar1->m_Callback != (_func_void_FBaseCVar_ptr *)0x0)) {
      (*pFVar1->m_Callback)(pFVar1);
    }
  }
  return;
}

Assistant:

void FBaseCVar::EnableCallbacks ()
{
	m_UseCallback = true;
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		if (!(cvar->Flags & CVAR_NOINITCALL))
		{
			cvar->Callback ();
		}
		cvar = cvar->m_Next;
	}
}